

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

uint32_t rgbcx::bc1_find_sels3_fullerr
                   (bool use_black,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint8_t uVar12;
  int iVar13;
  uint32_t i;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  
  uVar20 = lr >> 2 | lr * 8;
  uVar9 = lg >> 4 | lg * 4;
  uVar10 = lb >> 2 | lb * 8;
  uVar26 = hr >> 2 | hr * 8;
  uVar15 = hg >> 4 | hg * 4;
  uVar23 = hb >> 2 | hb * 8;
  if (g_bc1_approx_mode != 3) {
    if (g_bc1_approx_mode == 2) {
      uVar21 = (int)(uVar26 + uVar20 + 1) >> 1;
      uVar19 = (int)(uVar15 + uVar9 + 1) >> 1;
      uVar25 = (int)(uVar23 + uVar10 + 1) >> 1;
      goto LAB_0011b6da;
    }
    if (g_bc1_approx_mode != 0) {
      uVar21 = (int)((hr + lr) * 0x21) / 8;
      uVar19 = (int)((int)(uVar15 - uVar9) / 4 + uVar9 * 0x100 + (uVar15 - uVar9) * 0x80 + 0x80) /
               0x100;
      uVar25 = (int)((hb + lb) * 0x21) / 8;
      goto LAB_0011b6da;
    }
  }
  uVar21 = uVar26 + uVar20 >> 1;
  uVar19 = uVar15 + uVar9 >> 1;
  uVar25 = uVar23 + uVar10 >> 1;
LAB_0011b6da:
  lVar14 = 0;
  uVar11 = 0;
  while( true ) {
    if (lVar14 == 0x10) {
      return uVar11;
    }
    bVar1 = pSrc_pixels[lVar14].field_0.field_0.r;
    bVar2 = pSrc_pixels[lVar14].field_0.field_0.g;
    bVar3 = pSrc_pixels[lVar14].field_0.field_0.b;
    iVar4 = uVar20 - bVar1;
    iVar13 = uVar9 - bVar2;
    iVar5 = uVar10 - bVar3;
    uVar6 = iVar5 * iVar5 + iVar13 * iVar13 + iVar4 * iVar4;
    iVar5 = uVar26 - bVar1;
    iVar4 = uVar15 - bVar2;
    iVar13 = uVar23 - bVar3;
    uVar22 = iVar13 * iVar13 + iVar4 * iVar4 + iVar5 * iVar5;
    uVar18 = uVar22;
    if (uVar22 >= uVar6) {
      uVar18 = uVar6;
    }
    uVar24 = (uint)bVar1;
    uVar16 = (uint)bVar2;
    uVar17 = (uint)bVar3;
    uVar7 = (uVar25 - uVar17) * (uVar25 - uVar17) +
            (uVar19 - uVar16) * (uVar19 - uVar16) + (uVar21 - uVar24) * (uVar21 - uVar24);
    uVar8 = uVar7;
    if (uVar18 <= uVar7) {
      uVar8 = uVar18;
    }
    uVar12 = uVar22 < uVar6;
    if (uVar18 > uVar7) {
      uVar12 = '\x02';
    }
    if ((use_black) &&
       (uVar18 = uVar17 * uVar17 + uVar16 * uVar16 + uVar24 * uVar24, uVar18 < uVar8)) {
      uVar12 = '\x03';
      uVar8 = uVar18;
    }
    uVar11 = uVar11 + uVar8;
    if (cur_err <= uVar11) break;
    sels[lVar14] = uVar12;
    lVar14 = lVar14 + 1;
  }
  return uVar11;
}

Assistant:

static inline uint32_t bc1_find_sels3_fullerr(bool use_black, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t block_r[3], block_g[3], block_b[3];
		bc1_get_block_colors3(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);
								
		uint32_t total_err = 0;

		for (uint32_t i = 0; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r;
			const int g = pSrc_pixels[i].g;
			const int b = pSrc_pixels[i].b;

			uint32_t best_err = squarei((int)block_r[0] - (int)r) + squarei((int)block_g[0] - (int)g) + squarei((int)block_b[0] - (int)b);
			uint32_t best_sel = 0;

			uint32_t err1 = squarei((int)block_r[1] - (int)r) + squarei((int)block_g[1] - (int)g) + squarei((int)block_b[1] - (int)b);
			if (err1 < best_err)
			{
				best_err = err1;
				best_sel = 1;
			}

			uint32_t err2 = squarei((int)block_r[2] - (int)r) + squarei((int)block_g[2] - (int)g) + squarei((int)block_b[2] - (int)b);
			if (err2 < best_err)
			{
				best_err = err2;
				best_sel = 2;
			}

			if (use_black)
			{
				uint32_t err3 = squarei(r) + squarei(g) + squarei(b);
				if (err3 < best_err)
				{
					best_err = err3;
					best_sel = 3;
				}
			}
			
			total_err += best_err;
			if (total_err >= cur_err)
				return total_err;
			
			sels[i] = (uint8_t)best_sel;
		}

		return total_err;
	}